

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::LoopTestOverS<unsigned_int,false>
          (BufferTest *this,bool use_range_version,bool skip_rgb)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined3 in_register_00000011;
  
  PrepareProgram(this,s_fragment_shader_udecl_highp);
  bVar1 = Test<unsigned_int,4,false>(this,use_range_version);
  if (CONCAT31(in_register_00000011,skip_rgb) == 0) {
    bVar2 = Test<unsigned_int,3,false>(this,use_range_version);
    bVar1 = bVar1 && bVar2;
  }
  bVar2 = Test<unsigned_int,2,false>(this,use_range_version);
  bVar3 = Test<unsigned_int,1,false>(this,use_range_version);
  CleanProgram(this);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  do {
    iVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  } while (iVar5 != 0);
  return (bool)(bVar1 & bVar2 & bVar3);
}

Assistant:

bool BufferTest::LoopTestOverS(bool use_range_version, bool skip_rgb)
{
	/* Prepare one program per test loop. */
	PrepareProgram(FragmentShaderDeclaration<T, N>());

	/* Run tests. */
	bool result = Test<T, 4, N>(use_range_version);

	if (!skip_rgb)
	{
		result &= Test<T, 3, N>(use_range_version);
	}

	result &= Test<T, 2, N>(use_range_version);
	result &= Test<T, 1, N>(use_range_version);

	/* Cleanup.*/
	CleanProgram();
	CleanErrors();

	/* Pass result. */
	return result;
}